

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O3

void av1_subtract_block(BitDepthInfo bd_info,int rows,int cols,int16_t *diff,ptrdiff_t diff_stride,
                       uint8_t *src8,ptrdiff_t src_stride,uint8_t *pred8,ptrdiff_t pred_stride)

{
  if ((ulong)bd_info >> 0x20 == 0) {
    (*aom_subtract_block)(rows,cols,diff,diff_stride,src8,src_stride,pred8,pred_stride);
  }
  else {
    aom_highbd_subtract_block_sse2(rows,cols,diff,diff_stride,src8,src_stride,pred8,pred_stride);
  }
  return;
}

Assistant:

void av1_subtract_block(BitDepthInfo bd_info, int rows, int cols, int16_t *diff,
                        ptrdiff_t diff_stride, const uint8_t *src8,
                        ptrdiff_t src_stride, const uint8_t *pred8,
                        ptrdiff_t pred_stride) {
  assert(rows >= 4 && cols >= 4);
#if CONFIG_AV1_HIGHBITDEPTH
  if (bd_info.use_highbitdepth_buf) {
    aom_highbd_subtract_block(rows, cols, diff, diff_stride, src8, src_stride,
                              pred8, pred_stride);
    return;
  }
#endif
  (void)bd_info;
  aom_subtract_block(rows, cols, diff, diff_stride, src8, src_stride, pred8,
                     pred_stride);
}